

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void copy_recurse_data(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,int type,
                      int stackptr,int stacktop,BOOL has_quit)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  sljit_compiler *compiler;
  ulong uVar5;
  long lVar6;
  long lVar7;
  sljit_sw load_offset;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  compiler_common *cc_00;
  sljit_sw store_offset;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  sljit_sw private_srcw [2];
  sljit_sw shared_srcw [3];
  sljit_sw kept_shared_srcw [2];
  delayed_mem_copy_status status;
  compiler_common *local_118;
  uint local_110;
  uint local_100;
  long local_f8 [2];
  int local_e4;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  compiler_common *local_d0;
  ulong local_c8;
  uint local_bc;
  long local_b8 [4];
  long local_98 [4];
  compiler_common *local_78;
  delayed_mem_copy_status local_70;
  
  local_dc = stacktop;
  uVar11 = (ulong)(uint)type;
  local_78 = (compiler_common *)ccend;
  local_100 = 0xc;
  if (type - 1U < 3) {
    bVar4 = false;
  }
  else {
    if (type != 0) {
      local_100 = 4;
      bVar3 = true;
      bVar4 = false;
      goto LAB_00158f8e;
    }
    bVar4 = true;
  }
  bVar3 = false;
LAB_00158f8e:
  local_70.tmp_regs[0] = 1;
  local_70.saved_tmp_regs[0] = 1;
  if (bVar3) {
    local_70.saved_tmp_regs[1] = 5;
    local_70.tmp_regs[1] = 5;
  }
  else {
    local_70.tmp_regs[1] = 4;
    local_70.saved_tmp_regs[1] = 4;
  }
  uVar9 = stackptr * 8;
  local_70.saved_tmp_regs[2] = 3;
  local_70.next_tmp_reg = 0;
  local_70.tmp_regs[2] = 3;
  local_70.store_bases[0] = -1;
  local_70.store_bases[1] = -1;
  local_70.store_bases[2] = -1;
  local_70.compiler = common->compiler;
  local_bc = type - 4U;
  cc_00 = (compiler_common *)cc;
  if (type - 4U < 0xfffffffe) {
    if (!bVar4) {
      cc_00 = (compiler_common *)(ulong)local_100;
      delayed_mem_copy_move(&local_70,local_100,(ulong)uVar9,0xe,(long)common->recursive_head_ptr);
    }
    if (!(bool)(type != 4 & (bVar4 ^ 1U))) {
      cc_00 = (compiler_common *)&DAT_0000000e;
      delayed_mem_copy_move(&local_70,0xe,(long)common->recursive_head_ptr,local_100,(ulong)uVar9);
    }
  }
  if (cc < local_78) {
    uVar13 = (ulong)(uVar9 + 8);
    local_d8 = 0;
    bVar3 = false;
    local_e0 = 0;
    local_e4 = 0;
    local_98[3] = uVar11;
    local_d0 = common;
    do {
      switch(*(short *)&((compiler_common *)cc)->compiler) {
      case 3:
        bVar14 = local_e4 == 0;
        uVar9 = 0;
        if (bVar14 && local_dc != 0) {
          local_98[0] = (long)common->ovector_start;
          local_e4 = 1;
        }
        uVar8 = (uint)(bVar14 && local_dc != 0);
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 2);
        local_110 = 0;
        goto LAB_001596aa;
      default:
        local_118 = (compiler_common *)next_opcode((compiler_common *)cc,(PCRE2_SPTR16)cc_00);
        uVar9 = 0;
        local_110 = 0;
        break;
      case 0x21:
      case 0x23:
      case 0x2e:
      case 0x30:
      case 0x3b:
      case 0x3d:
      case 0x48:
      case 0x4a:
      case 0x5b:
      case 0x5c:
        lVar6 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar9 = 0;
        if (lVar6 != 0) {
          local_f8[0] = lVar6;
          local_f8[1] = lVar6 + 8;
          uVar9 = 2;
        }
        goto LAB_0015913e;
      case 0x22:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x2f:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x3c:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x49:
      case 0x4b:
      case 0x4c:
      case 0x4d:
        lVar6 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar9 = 0;
        if (lVar6 != 0) {
          local_f8[0] = lVar6;
          uVar9 = 1;
        }
LAB_0015913e:
        local_110 = 0;
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
        break;
      case 0x27:
      case 0x28:
      case 0x34:
      case 0x35:
      case 0x41:
      case 0x42:
      case 0x4e:
      case 0x4f:
        lVar6 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        local_110 = 0;
        uVar9 = 0;
        if (lVar6 != 0) {
          local_f8[0] = lVar6;
          local_f8[1] = lVar6 + 8;
          uVar9 = 2;
        }
        goto LAB_001593f4;
      case 0x55:
      case 0x57:
        lVar6 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar9 = 0;
        if (lVar6 != 0) {
          local_f8[0] = lVar6;
          local_f8[1] = lVar6 + 8;
          uVar9 = 2;
        }
        goto LAB_00159436;
      case 0x56:
      case 0x58:
      case 0x59:
      case 0x5a:
        lVar6 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar9 = 0;
        if (lVar6 != 0) {
          local_f8[0] = lVar6;
          uVar9 = 1;
        }
LAB_00159436:
        local_110 = 0;
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 2);
        break;
      case 0x6e:
      case 0x6f:
      case 0x70:
        uVar5 = 0x11;
        if (*(short *)&((compiler_common *)cc)->compiler == 0x70) {
          uVar5 = (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2);
        }
        lVar6 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        local_110 = 0;
        uVar9 = 0;
        if (lVar6 != 0) {
          uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + uVar5 * 2);
          cc_00 = (compiler_common *)(ulong)uVar1;
          uVar9 = uVar1 - 0x62;
          if (uVar9 < 8) {
            if ((0x3aU >> (uVar9 & 0x1f) & 1) == 0) {
              uVar8 = 2;
              if ((5U >> (uVar9 & 0x1f) & 1) == 0) {
                uVar2 = *(ushort *)((long)&((compiler_common *)cc)->compiler + uVar5 * 2 + 4);
                if (uVar2 == 0) {
                  uVar8 = (uVar1 == 0x68) + 1;
                }
                else {
                  uVar8 = (uint)uVar2 -
                          (uint)*(ushort *)
                                 ((long)&((compiler_common *)cc)->compiler + uVar5 * 2 + 2);
                  cc_00 = (compiler_common *)&DAT_00000002;
                  if (1 < uVar8) {
                    uVar8 = 2;
                  }
                }
              }
            }
            else {
              uVar8 = 1;
            }
          }
          else {
            uVar8 = 0;
          }
          if (uVar8 == 2) {
            local_f8[0] = lVar6;
            local_f8[1] = lVar6 + 8;
            uVar9 = 2;
          }
          else {
            uVar9 = 0;
            if (uVar8 == 1) {
              local_f8[0] = lVar6;
              uVar9 = 1;
            }
          }
        }
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + uVar5 * 2);
        break;
      case 0x75:
        if (local_dc == 0) {
          uVar8 = 0;
        }
        else {
          bVar15 = common->has_set_som != 0;
          bVar14 = local_e4 == 0;
          if (bVar14 && bVar15) {
            local_98[0] = (long)common->ovector_start;
            local_e4 = 1;
          }
          bVar14 = bVar14 && bVar15;
          uVar8 = (uint)bVar14;
          if (local_e0 == 0 && (long)common->mark_ptr != 0) {
            local_98[bVar14] = (long)common->mark_ptr;
            uVar8 = bVar14 + 1;
            local_e0 = 1;
          }
        }
        bVar14 = !bVar3 && (long)common->capture_last_ptr != 0;
        if (bVar14) {
          local_b8[0] = (long)common->capture_last_ptr;
          bVar3 = true;
        }
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
        goto LAB_00159231;
      case 0x79:
        lVar6 = (long)cc - (long)common->start;
        lVar7 = (long)*(int *)((long)common->private_data_ptrs + lVar6 * 2);
        local_110 = 0;
        if (lVar7 != 0) {
          local_f8[0] = lVar7;
          cc = (PCRE2_SPTR16)
               ((long)&((compiler_common *)cc)->compiler +
               (long)*(int *)((long)common->private_data_ptrs + lVar6 * 2 + 4) * 2);
        }
        uVar9 = (uint)(lVar7 != 0);
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
        break;
      case 0x7e:
      case 0x7f:
      case 0x80:
      case 0x81:
      case 0x82:
      case 0x84:
      case 0x88:
      case 0x89:
      case 0x8c:
        local_f8[0] = (long)*(int *)((long)common->private_data_ptrs +
                                    ((long)cc - (long)common->start) * 2);
        local_110 = 0;
        uVar9 = 1;
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
        break;
      case 0x85:
      case 0x8a:
        uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + 4);
        local_b8[0] = (ulong)uVar1 * 0x10 + (long)common->ovector_start;
        local_b8[1] = (ulong)uVar1 * 0x10 + (long)common->ovector_start + 8;
        lVar6 = (long)common->capture_last_ptr;
        cc_00 = (compiler_common *)CONCAT71((int7)((ulong)local_b8[0] >> 8),bVar3 || lVar6 == 0);
        local_110 = 2;
        if (!bVar3 && lVar6 != 0) {
          local_b8[2] = lVar6;
          bVar3 = true;
          local_110 = 3;
        }
        uVar9 = 0;
        if (common->optimized_cbracket[uVar1] == '\0') {
          local_f8[0] = (long)common->cbra_ptr + (ulong)uVar1 * 8;
          uVar9 = 1;
        }
LAB_001593f4:
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 6);
        break;
      case 0x86:
      case 0x8b:
        uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + 4);
        lVar6 = (ulong)uVar1 * 0x10;
        local_b8[0] = lVar6 + common->ovector_start;
        local_b8[1] = lVar6 + common->ovector_start + 8;
        uVar9 = 2;
        local_110 = 2;
        if (!bVar3 && (long)common->capture_last_ptr != 0) {
          local_b8[2] = (long)common->capture_last_ptr;
          bVar3 = true;
          local_110 = 3;
        }
        local_f8[0] = (long)*(int *)((long)common->private_data_ptrs +
                                    ((long)cc - (long)common->start) * 2);
        local_f8[1] = (long)common->cbra_ptr + (ulong)uVar1 * 8;
        cc_00 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 6);
        local_118 = cc_00;
        break;
      case 0x87:
        local_110 = 0;
        bVar14 = (*(ushort *)
                   ((long)&((compiler_common *)cc)->compiler +
                   (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2) * 2) & 0xfffe)
                 == 0x7a;
        if (bVar14) {
          local_f8[0] = (long)*(int *)((long)common->private_data_ptrs +
                                      ((long)cc - (long)common->start) * 2);
        }
        uVar9 = (uint)bVar14;
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
        break;
      case 0x96:
      case 0x98:
      case 0x9c:
      case 0x9e:
        bVar14 = local_e0 == 0;
        if (bVar14 && local_dc != 0) {
          local_98[0] = (long)common->mark_ptr;
          local_e0 = 1;
        }
        uVar8 = (uint)(bVar14 && local_dc != 0);
        bVar14 = (int)local_d8 == 0 && (long)common->control_head_ptr != 0;
        if (bVar14) {
          local_b8[0] = (long)common->control_head_ptr;
          local_d8 = 1;
        }
        local_118 = (compiler_common *)
                    ((long)&((compiler_common *)cc)->compiler +
                    (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2) * 2 + 6);
LAB_00159231:
        local_110 = (uint)bVar14;
        uVar9 = 0;
        goto LAB_001596aa;
      case 0x9b:
        uVar9 = 0;
        if ((int)local_d8 == 0) {
          local_b8[0] = (long)common->control_head_ptr;
        }
        local_110 = (uint)((int)local_d8 == 0);
        local_d8 = 1;
        local_118 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 2);
      }
      uVar8 = 0;
LAB_001596aa:
      if (local_bc < 0xfffffffe) {
        if (uVar9 != 0) {
          local_c8 = uVar13;
          uVar11 = 0;
          do {
            iVar12 = (int)uVar13 + (int)uVar11;
            if (!bVar4) {
              cc_00 = (compiler_common *)(ulong)local_100;
              delayed_mem_copy_move
                        (&local_70,local_100,(long)iVar12,0xe,*(sljit_sw *)((long)local_f8 + uVar11)
                        );
            }
            if (type == 4 || bVar4) {
              cc_00 = (compiler_common *)&DAT_0000000e;
              delayed_mem_copy_move
                        (&local_70,0xe,*(sljit_sw *)((long)local_f8 + uVar11),local_100,(long)iVar12
                        );
            }
            uVar11 = uVar11 + 8;
          } while (uVar9 << 3 != uVar11);
          uVar13 = (ulong)(uint)((int)local_c8 + (int)uVar11);
          uVar11 = local_98[3];
          common = local_d0;
        }
      }
      else {
        uVar13 = (ulong)((int)uVar13 + uVar9 * 8);
      }
      if (((uint)uVar11 | 2) == 3) {
        uVar13 = (ulong)((int)uVar13 + local_110 * 8);
      }
      else if (local_110 != 0) {
        local_c8 = uVar13;
        uVar11 = 0;
        do {
          iVar12 = (int)uVar13 + (int)uVar11;
          if (!bVar4) {
            cc_00 = (compiler_common *)(ulong)local_100;
            delayed_mem_copy_move
                      (&local_70,local_100,(long)iVar12,0xe,*(sljit_sw *)((long)local_b8 + uVar11));
          }
          if (type == 4 || bVar4) {
            cc_00 = (compiler_common *)&DAT_0000000e;
            delayed_mem_copy_move
                      (&local_70,0xe,*(sljit_sw *)((long)local_b8 + uVar11),local_100,(long)iVar12);
          }
          uVar11 = uVar11 + 8;
        } while (local_110 << 3 != uVar11);
        uVar13 = (ulong)(uint)((int)local_c8 + (int)uVar11);
        uVar11 = local_98[3];
        common = local_d0;
      }
      iVar12 = (int)uVar13;
      if (((int)uVar11 == 1) || ((int)uVar11 == 4)) {
        uVar13 = (ulong)(iVar12 + uVar8 * 8);
      }
      else if (uVar8 != 0) {
        uVar13 = 0;
        do {
          iVar10 = iVar12 + (int)uVar13;
          if (bVar4) {
            load_offset = *(sljit_sw *)((long)local_98 + uVar13);
            store_offset = (sljit_sw)iVar10;
            cc_00 = (compiler_common *)&DAT_0000000e;
            uVar9 = local_100;
          }
          else {
            load_offset = (sljit_sw)iVar10;
            store_offset = *(sljit_sw *)((long)local_98 + uVar13);
            cc_00 = (compiler_common *)(ulong)local_100;
            uVar9 = 0xe;
          }
          delayed_mem_copy_move(&local_70,(int)cc_00,load_offset,uVar9,store_offset);
          uVar13 = uVar13 + 8;
        } while (uVar8 << 3 != uVar13);
        uVar13 = (ulong)(uint)(iVar12 + (int)uVar13);
        common = local_d0;
      }
      cc = (PCRE2_SPTR16)local_118;
    } while (local_118 < local_78);
  }
  compiler = local_70.compiler;
  iVar10 = 3;
  iVar12 = local_70.next_tmp_reg;
  do {
    if (local_70.store_bases[iVar12] != 0xffffffff) {
      sljit_emit_op1(compiler,0x20,local_70.store_bases[iVar12] | 0x80,
                     (long)local_70.store_offsets[iVar12],local_70.tmp_regs[iVar12],0);
    }
    iVar12 = (iVar12 + 1) % 3;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  return;
}

Assistant:

static void copy_recurse_data(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend,
  int type, int stackptr, int stacktop, BOOL has_quit)
{
delayed_mem_copy_status status;
PCRE2_SPTR alternative;
sljit_sw private_srcw[2];
sljit_sw shared_srcw[3];
sljit_sw kept_shared_srcw[2];
int private_count, shared_count, kept_shared_count;
int from_sp, base_reg, offset, i;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
BOOL capture_last_found = FALSE;
BOOL control_head_found = FALSE;

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
SLJIT_ASSERT(common->control_head_ptr != 0);
control_head_found = TRUE;
#endif

switch (type)
  {
  case recurse_copy_from_global:
  from_sp = TRUE;
  base_reg = STACK_TOP;
  break;

  case recurse_copy_private_to_global:
  case recurse_copy_shared_to_global:
  case recurse_copy_kept_shared_to_global:
  from_sp = FALSE;
  base_reg = STACK_TOP;
  break;

  default:
  SLJIT_ASSERT(type == recurse_swap_global);
  from_sp = FALSE;
  base_reg = TMP2;
  break;
  }

stackptr = STACK(stackptr);
stacktop = STACK(stacktop);

status.tmp_regs[0] = TMP1;
status.saved_tmp_regs[0] = TMP1;

if (base_reg != TMP2)
  {
  status.tmp_regs[1] = TMP2;
  status.saved_tmp_regs[1] = TMP2;
  }
else
  {
  status.saved_tmp_regs[1] = RETURN_ADDR;
  if (sljit_get_register_index (RETURN_ADDR) == -1)
    status.tmp_regs[1] = STR_PTR;
  else
    status.tmp_regs[1] = RETURN_ADDR;
  }

status.saved_tmp_regs[2] = TMP3;
if (sljit_get_register_index (TMP3) == -1)
  status.tmp_regs[2] = STR_END;
else
  status.tmp_regs[2] = TMP3;

delayed_mem_copy_init(&status, common);

if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
  {
  SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->recursive_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->recursive_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
if (type != recurse_copy_shared_to_global)
  {
  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->control_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->control_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);
#endif

while (cc < ccend)
  {
  private_count = 0;
  shared_count = 0;
  kept_shared_count = 0;

  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    if (has_quit && !setsom_found)
      {
      kept_shared_srcw[0] = OVECTOR(0);
      kept_shared_count = 1;
      setsom_found = TRUE;
      }
    cc += 1;
    break;

    case OP_RECURSE:
    if (has_quit)
      {
      if (common->has_set_som && !setsom_found)
        {
        kept_shared_srcw[0] = OVECTOR(0);
        kept_shared_count = 1;
        setsom_found = TRUE;
        }
      if (common->mark_ptr != 0 && !setmark_found)
        {
        kept_shared_srcw[kept_shared_count] = common->mark_ptr;
        kept_shared_count++;
        setmark_found = TRUE;
        }
      }
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[0] = common->capture_last_ptr;
      shared_count = 1;
      capture_last_found = TRUE;
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_KET:
    if (PRIVATE_DATA(cc) != 0)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      SLJIT_ASSERT(PRIVATE_DATA(cc + 1) != 0);
      cc += PRIVATE_DATA(cc + 1);
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    case OP_ONCE:
    case OP_BRAPOS:
    case OP_SBRA:
    case OP_SBRAPOS:
    case OP_SCOND:
    private_count = 1;
    private_srcw[0] = PRIVATE_DATA(cc);
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_SCBRA:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    if (common->optimized_cbracket[GET2(cc, 1 + LINK_SIZE)] == 0)
      {
      private_count = 1;
      private_srcw[0] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
      }
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    private_count = 2;
    private_srcw[0] = PRIVATE_DATA(cc);
    private_srcw[1] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_COND:
    /* Might be a hidden SCOND. */
    alternative = cc + GET(cc, 1);
    if (*alternative == OP_KETRMAX || *alternative == OP_KETRMIN)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1 + LINK_SIZE;
    break;

    CASE_ITERATOR_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1 + IMM2_SIZE;
    break;

    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
    i = (*cc == OP_XCLASS) ? GET(cc, 1) : 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#else
    i = 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#endif
    if (PRIVATE_DATA(cc) != 0)
      switch(get_class_iterator_size(cc + i))
        {
        case 1:
        private_count = 1;
        private_srcw[0] = PRIVATE_DATA(cc);
        break;

        case 2:
        private_count = 2;
        private_srcw[0] = PRIVATE_DATA(cc);
        private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
        break;

        default:
        SLJIT_UNREACHABLE();
        break;
        }
    cc += i;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (has_quit && !setmark_found)
      {
      kept_shared_srcw[0] = common->mark_ptr;
      kept_shared_count = 1;
      setmark_found = TRUE;
      }
    if (common->control_head_ptr != 0 && !control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_THEN:
    SLJIT_ASSERT(common->control_head_ptr != 0);
    if (!control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc++;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }

  if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

    for (i = 0; i < private_count; i++)
      {
      SLJIT_ASSERT(private_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, private_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, private_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * private_count;

  if (type != recurse_copy_private_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_swap_global);

    for (i = 0; i < shared_count; i++)
      {
      SLJIT_ASSERT(shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * shared_count;

  if (type != recurse_copy_private_to_global && type != recurse_swap_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_copy_kept_shared_to_global);

    for (i = 0; i < kept_shared_count; i++)
      {
      SLJIT_ASSERT(kept_shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, kept_shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, kept_shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * kept_shared_count;
  }